

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp8_dec.c
# Opt level: O0

int GetCoeffsFast(VP8BitReader *br,VP8BandProbas **prob,int ctx,int *dq,int n,int16_t *out)

{
  int iVar1;
  VP8BitReader *br_00;
  long in_RCX;
  int in_EDX;
  long in_RSI;
  int in_R8D;
  uint8_t *in_R9;
  int v;
  VP8ProbaArray *p_ctx;
  uint8_t *p;
  long in_stack_ffffffffffffffb8;
  int iVar2;
  undefined4 in_stack_ffffffffffffffd0;
  
  br_00 = (VP8BitReader *)(*(long *)(in_RSI + (long)in_R8D * 8) + (long)in_EDX * 0xb);
  while( true ) {
    if (0xf < in_R8D) {
      return 0x10;
    }
    iVar2 = (int)((ulong)in_stack_ffffffffffffffb8 >> 0x20);
    iVar1 = VP8GetBit(br_00,iVar2);
    if (iVar1 == 0) break;
    while (iVar1 = VP8GetBit(br_00,iVar2), iVar1 == 0) {
      in_R8D = in_R8D + 1;
      br_00 = *(VP8BitReader **)(in_RSI + (long)in_R8D * 8);
      if (in_R8D == 0x10) {
        return 0x10;
      }
    }
    in_stack_ffffffffffffffb8 = *(long *)(in_RSI + (long)(in_R8D + 1) * 8);
    iVar2 = (int)((ulong)in_stack_ffffffffffffffb8 >> 0x20);
    iVar1 = VP8GetBit(br_00,iVar2);
    if (iVar1 == 0) {
      br_00 = (VP8BitReader *)(in_stack_ffffffffffffffb8 + 0xb);
    }
    else {
      GetLargeValue((VP8BitReader *)CONCAT44(in_R8D,in_stack_ffffffffffffffd0),in_R9);
      br_00 = (VP8BitReader *)(in_stack_ffffffffffffffb8 + 0x16);
    }
    iVar1 = VP8GetSigned(br_00,iVar2);
    *(short *)(in_R9 + (ulong)""[in_R8D] * 2) =
         (short)iVar1 * (short)*(undefined4 *)(in_RCX + (long)(int)(uint)(0 < in_R8D) * 4);
    in_R8D = in_R8D + 1;
  }
  return in_R8D;
}

Assistant:

static int GetCoeffsFast(VP8BitReader* const br,
                         const VP8BandProbas* const prob[],
                         int ctx, const quant_t dq, int n, int16_t* out) {
  const uint8_t* p = prob[n]->probas[ctx];
  for (; n < 16; ++n) {
    if (!VP8GetBit(br, p[0], "coeffs")) {
      return n;  // previous coeff was last non-zero coeff
    }
    while (!VP8GetBit(br, p[1], "coeffs")) {       // sequence of zero coeffs
      p = prob[++n]->probas[0];
      if (n == 16) return 16;
    }
    {        // non zero coeff
      const VP8ProbaArray* const p_ctx = &prob[n + 1]->probas[0];
      int v;
      if (!VP8GetBit(br, p[2], "coeffs")) {
        v = 1;
        p = p_ctx[1];
      } else {
        v = GetLargeValue(br, p);
        p = p_ctx[2];
      }
      out[kZigzag[n]] = VP8GetSigned(br, v, "coeffs") * dq[n > 0];
    }
  }
  return 16;
}